

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sh.cpp
# Opt level: O1

void SHRotateXMinus(rot_data_t *c_in,rot_data_t *c_out,int lmax)

{
  ulong uVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  ulong uVar6;
  int iVar7;
  ulong uVar8;
  float fVar9;
  
  SHRotateXPlus(c_in,c_out,lmax);
  if (0 < lmax) {
    iVar3 = 2;
    uVar2 = lmax + 1U;
    if ((int)(lmax + 1U) < 3) {
      uVar2 = 2;
    }
    iVar5 = 4;
    iVar4 = 1;
    uVar6 = 1;
    do {
      fVar9 = *(float *)(&DAT_00195788 + (ulong)((uVar6 & 1) == 0) * 4);
      uVar1 = uVar6 + 1;
      iVar7 = (int)uVar6 * (int)uVar1;
      c_out[iVar7] = c_out[iVar7] * fVar9;
      uVar8 = 0;
      iVar7 = iVar4;
      do {
        c_out[(long)iVar3 + uVar8 + 1] = -fVar9 * c_out[(long)iVar3 + uVar8 + 1];
        c_out[iVar7] = fVar9 * c_out[iVar7];
        uVar8 = uVar8 + 1;
        iVar7 = iVar7 + -1;
        fVar9 = -fVar9;
      } while (uVar6 != uVar8);
      iVar3 = iVar3 + iVar5;
      iVar4 = iVar4 + iVar5;
      iVar5 = iVar5 + 2;
      uVar6 = uVar1;
    } while (uVar1 != uVar2);
  }
  return;
}

Assistant:

void SHRotateXMinus(const rot_data_t *c_in, rot_data_t *c_out, int lmax) {
    // -x rotations are the same as +x rotations, just with a negation
    // factor thrown in for some of the terms.
    SHRotateXPlus(c_in, c_out, lmax);

    // l = 0 band is a no op...
    for (int l = 1; l <= lmax; ++l) {
        float s = (l & 0x1) ? -1.f : 1.f;
        c_out[SHIndex(l, 0)] *= s;
        for (int m = 1; m <= l; ++m) {
            s = -s;
            c_out[SHIndex(l, m)] *= s;
            c_out[SHIndex(l, -m)] *= -s;
        }
    }
}